

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O0

ctrl_t * __thiscall
absl::lts_20250127::container_internal::
raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<int,_float>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_float>_>_>
::control(raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<int,_float>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_float>_>_>
          *this)

{
  bool bVar1;
  CommonFields *this_00;
  ctrl_t *pcVar2;
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<int,_float>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_float>_>_>
  *this_local;
  
  bVar1 = is_soo(this);
  if (bVar1) {
    __assert_fail("(!is_soo()) && \"Try enabling sanitizers.\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0x1017,
                  "ctrl_t *absl::container_internal::raw_hash_set<absl::container_internal::FlatHashMapPolicy<int, float>, absl::hash_internal::Hash<int>, std::equal_to<int>, std::allocator<std::pair<const int, float>>>::control() const [Policy = absl::container_internal::FlatHashMapPolicy<int, float>, Hash = absl::hash_internal::Hash<int>, Eq = std::equal_to<int>, Alloc = std::allocator<std::pair<const int, float>>]"
                 );
  }
  this_00 = common(this);
  pcVar2 = CommonFields::control(this_00);
  return pcVar2;
}

Assistant:

ctrl_t* control() const {
    ABSL_SWISSTABLE_ASSERT(!is_soo());
    return common().control();
  }